

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayoutInfo::clear(QDockAreaLayoutInfo *this)

{
  QList<QDockAreaLayoutItem>::clear(&this->item_list);
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  this->tabbed = false;
  this->tabBar = (QTabBar *)0x0;
  return;
}

Assistant:

void QDockAreaLayoutInfo::clear()
{
    item_list.clear();
    rect = QRect();
#if QT_CONFIG(tabbar)
    tabbed = false;
    tabBar = nullptr;
#endif
}